

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O2

void testConversion(string *tempDir)

{
  uint *puVar1;
  uint *puVar2;
  float *pfVar3;
  float fVar4;
  ushort uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  Compression *pCVar12;
  char *pcVar13;
  half *phVar14;
  int y;
  ulong uVar15;
  uint *puVar16;
  ulong uVar17;
  long lVar18;
  int x;
  long lVar19;
  uint *puVar20;
  int iVar21;
  half *phVar22;
  long lVar23;
  Compression comp;
  int y_6;
  long lVar24;
  Array2D<unsigned_int> inPixels;
  Array2D<unsigned_int> outPixels;
  OutputFile out;
  ulong auStack_c0 [2];
  ulong *local_b0;
  ulong *local_a8;
  undefined8 local_a0;
  Header hdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar11 = std::operator<<((ostream *)&std::cout,"Testing conversion between pixel data types");
  std::endl<char,std::char_traits<char>>(poVar11);
  poVar11 = std::operator<<((ostream *)&std::cout,"individual numbers");
  std::endl<char,std::char_traits<char>>(poVar11);
  anon_unknown.dwarf_98c09::testFloatToUint(0,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0x3f000000,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0xbf000000,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0x42f82000,0x7c);
  anon_unknown.dwarf_98c09::testFloatToUint(0xc2f82000,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0x58635fa9,0xffffffff);
  anon_unknown.dwarf_98c09::testFloatToUint(0xd8635fa9,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0x7f800000,0xffffffff);
  anon_unknown.dwarf_98c09::testFloatToUint(0xff800000,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0x7fffffff,0);
  anon_unknown.dwarf_98c09::testFloatToUint(0xffffffff,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0x3800,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0xb800,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0x57c1,0x7c);
  anon_unknown.dwarf_98c09::testHalfToUint(0xd7c1,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0x7c00,0xffffffff);
  anon_unknown.dwarf_98c09::testHalfToUint(0xfc00,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0x7fff,0);
  anon_unknown.dwarf_98c09::testHalfToUint(0xffff,0);
  anon_unknown.dwarf_98c09::testFloatToHalf(0,0);
  anon_unknown.dwarf_98c09::testFloatToHalf(0x3f000000,0x3800);
  anon_unknown.dwarf_98c09::testFloatToHalf(0xbf000000,0xb800);
  anon_unknown.dwarf_98c09::testFloatToHalf(0x42f82000,0x57c1);
  anon_unknown.dwarf_98c09::testFloatToHalf(0xc2f82000,0xd7c1);
  anon_unknown.dwarf_98c09::testFloatToHalf(0x58635fa9,0x7c00);
  anon_unknown.dwarf_98c09::testFloatToHalf(0xd8635fa9,0xfc00);
  anon_unknown.dwarf_98c09::testFloatToHalf(0x7f800000,0x7c00);
  anon_unknown.dwarf_98c09::testFloatToHalf(0xff800000,0xfc00);
  anon_unknown.dwarf_98c09::testFloatToHalf(0x7fffffff,0x7fff);
  anon_unknown.dwarf_98c09::testFloatToHalf(0xffffffff,0xffff);
  anon_unknown.dwarf_98c09::testUintToHalf(0,0);
  anon_unknown.dwarf_98c09::testUintToHalf(1,0x3c00);
  anon_unknown.dwarf_98c09::testUintToHalf(0x7c,0x57c0);
  anon_unknown.dwarf_98c09::testUintToHalf(1000000,0x7c00);
  anon_unknown.dwarf_98c09::testUintToHalf(0xffffffff,0x7c00);
  poVar11 = std::operator<<((ostream *)&std::cout,
                            "conversion of image channels while reading a file ");
  std::endl<char,std::char_traits<char>>(poVar11);
  comp = NO_COMPRESSION;
  do {
    if (comp == NUM_COMPRESSION_METHODS) {
      poVar11 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar11);
      return;
    }
    if ((comp & (DWAA_COMPRESSION|B44_COMPRESSION)) != B44_COMPRESSION) {
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar10 = (int)(Channel *)&out;
      Imf_3_4::OutputFile::writePixels(iVar10);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          puVar1 = puVar16 + lVar23;
          puVar2 = puVar20 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 != *puVar2) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d027;
          }
        }
        puVar20 = puVar20 + outPixels._sizeY;
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar10);
      iVar9 = Imf_3_4::TiledOutputFile::numYTiles(iVar10);
      Imf_3_4::TiledOutputFile::writeTiles(iVar10,0,iVar8 + -1,0,iVar9 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar21 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar21);
      iVar9 = Imf_3_4::TiledInputFile::numYTiles(iVar21);
      Imf_3_4::TiledInputFile::readTiles(iVar21,0,iVar8 + -1,0,iVar9 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          puVar1 = puVar16 + lVar23;
          puVar2 = puVar20 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 != *puVar2) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d046;
          }
        }
        puVar20 = puVar20 + outPixels._sizeY;
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels(iVar10);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar18 * 2 + inPixels._sizeY * lVar19);
          Imath_3_2::half::half
                    ((half *)&hdr,
                     (float)*(uint *)((long)outPixels._data + lVar18 * 4 + outPixels._sizeY * lVar23
                                     ));
          fVar4 = *(float *)(_imath_half_to_float_table + (ulong)uVar5 * 4);
          lVar18 = lVar18 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table + (ulong)_hdr * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d027;
          }
        }
        lVar23 = lVar23 + 4;
        lVar19 = lVar19 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(TileDescription *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar18 * 2 + inPixels._sizeY * lVar19);
          Imath_3_2::half::half
                    ((half *)&hdr,
                     (float)*(uint *)((long)outPixels._data + lVar18 * 4 + outPixels._sizeY * lVar23
                                     ));
          fVar4 = *(float *)(_imath_half_to_float_table + (ulong)uVar5 * 4);
          lVar18 = lVar18 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table + (ulong)_hdr * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d046;
          }
        }
        lVar23 = lVar23 + 4;
        lVar19 = lVar19 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar24 = 0;
        while (lVar24 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar24 * 4 + inPixels._sizeY * lVar19
                                       ),
                             (float)*(uint *)((long)outPixels._data +
                                             lVar24 * 4 + outPixels._sizeY * lVar19),comp);
          lVar24 = lVar24 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0013d027;
          }
        }
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)uVar17;
          uVar17 = (ulong)((uint)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar24 = 0;
        while (lVar24 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar24 * 4 + inPixels._sizeY * lVar19
                                       ),
                             (float)*(uint *)((long)outPixels._data +
                                             lVar24 * 4 + outPixels._sizeY * lVar19),comp);
          lVar24 = lVar24 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0013d046;
          }
        }
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          lVar24 = lVar23 * 2;
          puVar1 = puVar16 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 !=
              (uint)(long)*(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)puVar20 + lVar24) * 4)) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d027;
          }
        }
        puVar20 = (uint *)((long)puVar20 + outPixels._sizeY * 2);
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          lVar24 = lVar23 * 2;
          puVar1 = puVar16 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 !=
              (uint)(long)*(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)puVar20 + lVar24) * 4)) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d046;
          }
        }
        puVar20 = (uint *)((long)puVar20 + outPixels._sizeY * 2);
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          lVar24 = lVar23 * 2;
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)puVar16 + lVar23 * 2) * 4);
          lVar23 = lVar23 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)puVar20 + lVar24) * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d027;
          }
        }
        puVar20 = (uint *)((long)puVar20 + outPixels._sizeY * 2);
        puVar16 = (uint *)((long)puVar16 + inPixels._sizeY * 2);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          lVar24 = lVar23 * 2;
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)puVar16 + lVar23 * 2) * 4);
          lVar23 = lVar23 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)puVar20 + lVar24) * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d046;
          }
        }
        puVar20 = (uint *)((long)puVar20 + outPixels._sizeY * 2);
        puVar16 = (uint *)((long)puVar16 + inPixels._sizeY * 2);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar18 * 4 + inPixels._sizeY * lVar19
                                       ),
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               ((long)outPixels._data +
                                               lVar18 * 2 + outPixels._sizeY * lVar23) * 4),comp);
          lVar18 = lVar18 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0013d027;
          }
        }
        lVar23 = lVar23 + 2;
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      phVar14 = (half *)operator_new__(0x536de);
      outPixels._data = (uint *)phVar14;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        phVar22 = phVar14;
        for (lVar23 = 0; lVar23 != 0xc62; lVar23 = lVar23 + 10) {
          Imath_3_2::half::operator=(phVar22,(float)((int)lVar19 + (int)lVar23));
          phVar22 = phVar22 + 1;
        }
        phVar14 = phVar14 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(TileDescription *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar18 * 4 + inPixels._sizeY * lVar19
                                       ),
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               ((long)outPixels._data +
                                               lVar18 * 2 + outPixels._sizeY * lVar23) * 4),comp);
          lVar18 = lVar18 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0013d046;
          }
        }
        lVar23 = lVar23 + 2;
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar10 = (int)(Channel *)&out;
      Imf_3_4::OutputFile::writePixels(iVar10);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          pfVar3 = (float *)(puVar20 + lVar23);
          puVar1 = puVar16 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 != (uint)(long)*pfVar3) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d027;
          }
        }
        puVar20 = puVar20 + outPixels._sizeY;
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar10);
      iVar9 = Imf_3_4::TiledOutputFile::numYTiles(iVar10);
      Imf_3_4::TiledOutputFile::writeTiles(iVar10,0,iVar8 + -1,0,iVar9 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar21 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar21);
      iVar9 = Imf_3_4::TiledInputFile::numYTiles(iVar21);
      Imf_3_4::TiledInputFile::readTiles(iVar21,0,iVar8 + -1,0,iVar9 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar16 = inPixels._data;
      puVar20 = outPixels._data;
      for (lVar19 = 0; lVar19 != 0x21b; lVar19 = lVar19 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          pfVar3 = (float *)(puVar20 + lVar23);
          puVar1 = puVar16 + lVar23;
          lVar23 = lVar23 + 1;
          if (*puVar1 != (uint)(long)*pfVar3) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0013d046;
          }
        }
        puVar20 = puVar20 + outPixels._sizeY;
        puVar16 = puVar16 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels(iVar10);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar18 * 2 + inPixels._sizeY * lVar19);
          Imath_3_2::half::half
                    ((half *)&hdr,
                     *(float *)((long)outPixels._data + lVar18 * 4 + outPixels._sizeY * lVar23));
          fVar4 = *(float *)(_imath_half_to_float_table + (ulong)uVar5 * 4);
          lVar18 = lVar18 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table + (ulong)_hdr * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d027;
          }
        }
        lVar23 = lVar23 + 4;
        lVar19 = lVar19 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(TileDescription *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      lVar23 = 0;
      for (lVar24 = 0; lVar24 != 0x21b; lVar24 = lVar24 + 1) {
        lVar18 = 0;
        while (lVar18 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar18 * 2 + inPixels._sizeY * lVar19);
          Imath_3_2::half::half
                    ((half *)&hdr,
                     *(float *)((long)outPixels._data + lVar18 * 4 + outPixels._sizeY * lVar23));
          fVar4 = *(float *)(_imath_half_to_float_table + (ulong)uVar5 * 4);
          lVar18 = lVar18 + 1;
          pfVar3 = (float *)(_imath_half_to_float_table + (ulong)_hdr * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0013d046;
          }
        }
        lVar23 = lVar23 + 4;
        lVar19 = lVar19 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar24 = 0;
        while (lVar24 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar24 * 4 + inPixels._sizeY * lVar19
                                       ),
                             *(float *)((long)outPixels._data +
                                       lVar24 * 4 + outPixels._sizeY * lVar19),comp);
          lVar24 = lVar24 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
LAB_0013d027:
            __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                          ,0xd4,pcVar13);
          }
        }
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_50._M_dataplus._M_p;
      poVar11 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,comp);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"output type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      poVar11 = std::operator<<(poVar11,", ");
      poVar11 = std::operator<<(poVar11,"input type ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,2);
      std::operator<<(poVar11,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar16 = outPixels._data;
      for (uVar15 = 0; uVar15 != 0x21b; uVar15 = uVar15 + 1) {
        uVar17 = uVar15 & 0xffffffff;
        for (lVar19 = 0; lVar19 != 0x13d; lVar19 = lVar19 + 1) {
          puVar16[lVar19] = (uint)(float)(int)uVar17;
          uVar17 = (ulong)((int)uVar17 + 10);
        }
        puVar16 = puVar16 + 0x13d;
      }
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_c0[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = comp;
      pcVar13 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a26da);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,false,false)
      ;
      Imf_3_4::FrameBuffer::insert((char *)&inPixels,(Slice *)0x1a26da);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar9 = (int)(Channel *)&out;
      iVar8 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
      Imf_3_4::TiledOutputFile::writeTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&inPixels);
      Imf_3_4::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      auStack_c0[0] = auStack_c0[0] & 0xffffffff00000000;
      auStack_c0[1] = 0;
      local_b0 = auStack_c0;
      local_a0 = 0;
      local_a8 = local_b0;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1a26da);
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar9 = (int)(Slice *)&hdr;
      iVar8 = Imf_3_4::TiledInputFile::numXTiles(iVar9);
      iVar10 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
      Imf_3_4::TiledInputFile::readTiles(iVar9,0,iVar8 + -1,0,iVar10 + -1);
      Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar19 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar24 = 0;
        while (lVar24 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar24 * 4 + inPixels._sizeY * lVar19
                                       ),
                             *(float *)((long)outPixels._data +
                                       lVar24 * 4 + outPixels._sizeY * lVar19),comp);
          lVar24 = lVar24 + 1;
          if (!bVar7) {
            pcVar13 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
LAB_0013d046:
            __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                          ,0x129,pcVar13);
          }
        }
        lVar19 = lVar19 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_50);
    }
    comp = comp + RLE_COMPRESSION;
  } while( true );
}

Assistant:

void
testConversion (const std::string& tempDir)
{
    try
    {
        cout << "Testing conversion between pixel data types" << endl;

        cout << "individual numbers" << endl;

        testNumbers ();

        cout << "conversion of image channels while reading a file " << endl;

        for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
        {
            if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION)
            {
                continue;
            }

            testImageChannel<unsigned int, IMF::UINT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));
        }
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}